

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Person *p)

{
  ostream *poVar1;
  int *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"Person{ age: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1,", name: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 2));
  poVar1 = std::operator<<(poVar1," }");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Person& p)
{
  return out << "Person{ age: " << p.age << ", name: " << p.name << " }";
}